

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

View<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
          (View<int,_false,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          View<int,_false,_std::allocator<unsigned_long>_> *this,size_t dimension,size_t value)

{
  ulong uVar1;
  size_t *psVar2;
  long lVar3;
  size_t sVar4;
  reference piVar5;
  size_t *psVar6;
  size_t sVar7;
  runtime_error *prVar8;
  pointer piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  testInvariant(this);
  if (this->data_ == (pointer)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Assertion failed.");
  }
  else if ((dimension < (this->geometry_).dimension_) &&
          (sVar4 = shape(this,dimension), value < sVar4)) {
    if (this->data_ != (pointer)0x0) {
      if ((this->geometry_).dimension_ == 1) {
        piVar5 = operator()(this,value);
        __return_storage_ptr__->data_ = piVar5;
        psVar6 = (size_t *)operator_new(0);
        (__return_storage_ptr__->geometry_).shape_ = psVar6;
        (__return_storage_ptr__->geometry_).shapeStrides_ = psVar6;
        (__return_storage_ptr__->geometry_).strides_ = psVar6;
        (__return_storage_ptr__->geometry_).dimension_ = 0;
        (__return_storage_ptr__->geometry_).size_ = 1;
        (__return_storage_ptr__->geometry_).coordinateOrder_ = LastMajorOrder;
        (__return_storage_ptr__->geometry_).isSimple_ = true;
        testInvariant(__return_storage_ptr__);
        testInvariant(this);
        (__return_storage_ptr__->geometry_).coordinateOrder_ = (this->geometry_).coordinateOrder_;
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->data_ = (pointer)0x0;
      (__return_storage_ptr__->geometry_).shape_ = (size_t *)0x0;
      (__return_storage_ptr__->geometry_).shapeStrides_ = (size_t *)0x0;
      (__return_storage_ptr__->geometry_).strides_ = (size_t *)0x0;
      (__return_storage_ptr__->geometry_).dimension_ = 0;
      (__return_storage_ptr__->geometry_).size_ = 0;
      (__return_storage_ptr__->geometry_).coordinateOrder_ = LastMajorOrder;
      (__return_storage_ptr__->geometry_).isSimple_ = true;
      testInvariant(__return_storage_ptr__);
      if (this->data_ == (pointer)0x0) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Assertion failed.");
      }
      else {
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
                  (&__return_storage_ptr__->geometry_,(this->geometry_).dimension_ - 1);
        testInvariant(this);
        (__return_storage_ptr__->geometry_).coordinateOrder_ = (this->geometry_).coordinateOrder_;
        uVar12 = (this->geometry_).size_;
        sVar4 = shape(this,dimension);
        (__return_storage_ptr__->geometry_).size_ = uVar12 / sVar4;
        piVar9 = this->data_;
        if (piVar9 == (pointer)0x0) {
LAB_00229d00:
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"Assertion failed.");
LAB_00229d58:
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((this->geometry_).dimension_ != 0) {
          sVar4 = 0;
          uVar12 = 0;
          do {
            if (dimension != sVar4) {
              sVar7 = shape(this,sVar4);
              if ((__return_storage_ptr__->geometry_).dimension_ <= uVar12) {
                prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar8,"Assertion failed.");
                goto LAB_00229d58;
              }
              (__return_storage_ptr__->geometry_).shape_[uVar12] = sVar7;
              sVar7 = strides(this,sVar4);
              if ((__return_storage_ptr__->geometry_).dimension_ <= uVar12) {
                prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar8,"Assertion failed.");
                goto LAB_00229d58;
              }
              (__return_storage_ptr__->geometry_).strides_[uVar12] = sVar7;
              uVar12 = uVar12 + 1;
            }
            piVar9 = this->data_;
            if (piVar9 == (pointer)0x0) goto LAB_00229d00;
            sVar4 = sVar4 + 1;
          } while (sVar4 < (this->geometry_).dimension_);
        }
        sVar4 = (__return_storage_ptr__->geometry_).dimension_;
        if (sVar4 != 0) {
          psVar6 = (__return_storage_ptr__->geometry_).shape_;
          psVar2 = (__return_storage_ptr__->geometry_).shapeStrides_;
          if ((__return_storage_ptr__->geometry_).coordinateOrder_ == FirstMajorOrder) {
            psVar2[sVar4 - 1] = 1;
            if (sVar4 != 1) {
              sVar7 = psVar2[sVar4 - 1];
              do {
                sVar7 = sVar7 * psVar6[sVar4 - 1];
                psVar2[sVar4 - 2] = sVar7;
                sVar4 = sVar4 - 1;
              } while (sVar4 != 1);
            }
          }
          else {
            *psVar2 = 1;
            if (sVar4 != 1) {
              sVar7 = *psVar2;
              lVar10 = 0;
              do {
                sVar7 = sVar7 * psVar6[lVar10];
                psVar2[lVar10 + 1] = sVar7;
                lVar10 = lVar10 + 1;
              } while (sVar4 - 1 != lVar10);
            }
          }
          sVar4 = strides(this,dimension);
          __return_storage_ptr__->data_ = piVar9 + sVar4 * value;
          uVar12 = (__return_storage_ptr__->geometry_).dimension_;
          bVar13 = true;
          if (uVar12 != 0) {
            psVar6 = (__return_storage_ptr__->geometry_).shapeStrides_;
            psVar2 = (__return_storage_ptr__->geometry_).strides_;
            if (*psVar6 == *psVar2) {
              uVar11 = 0;
              do {
                if (uVar12 - 1 == uVar11) goto LAB_00229ce3;
                lVar10 = uVar11 + 1;
                uVar1 = uVar11 + 1;
                lVar3 = uVar11 + 1;
                uVar11 = uVar1;
              } while (psVar6[lVar10] == psVar2[lVar3]);
              bVar13 = uVar12 <= uVar1;
            }
            else {
              bVar13 = false;
            }
          }
LAB_00229ce3:
          (__return_storage_ptr__->geometry_).isSimple_ = bVar13;
          testInvariant(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar8,"Assertion failed.");
      }
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Assertion failed.");
  }
  else {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar8,"Assertion failed.");
  }
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

View<T, isConst, A>
View<T, isConst, A>::boundView
(
    const std::size_t dimension,
    const std::size_t value
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || (dimension < this->dimension()
        && value < shape(dimension)));
    if(this->dimension() == 1) {
        View v(&((*this)(value)));
        v.geometry_.coordinateOrder() = coordinateOrder();
        return v;
    }
    else {
        View v;
        v.geometry_.resize(this->dimension()-1);
        v.geometry_.coordinateOrder() = coordinateOrder();
        v.geometry_.size() = size() / shape(dimension);
        for(std::size_t j=0, k=0; j<this->dimension(); ++j) {
            if(j != dimension) {
                v.geometry_.shape(k) = shape(j);
                v.geometry_.strides(k) = strides(j);
                ++k;
            }
        }
        marray_detail::stridesFromShape(v.geometry_.shapeBegin(), v.geometry_.shapeEnd(),
            v.geometry_.shapeStridesBegin(), v.geometry_.coordinateOrder());
        v.data_ = data_ + strides(dimension) * value;
        v.updateSimplicity();
        v.testInvariant();
        return v;
    }
}